

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O0

void Disa::level_expansion<Disa::Adjacency_Subgraph>
               (Adjacency_Subgraph *graph,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *seeds,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_color)

{
  value_type vVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  bool bVar3;
  reference puVar4;
  source_location *psVar5;
  size_t sVar6;
  size_type sVar7;
  reference puVar8;
  reference this;
  const_reference pvVar9;
  reference pvVar10;
  iterator iVar11;
  iterator iVar12;
  value_type *pvVar13;
  reference pvVar14;
  unsigned_long uVar15;
  source_location *psVar16;
  ostream *poVar17;
  source_location *in_RCX;
  span<const_unsigned_long,_18446744073709551615UL> sVar18;
  reference local_368;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined **local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  reference local_220;
  unsigned_long *vertex;
  iterator __end0;
  iterator __begin0;
  span<const_unsigned_long,_18446744073709551615UL> *__range5;
  size_t front;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> new_queue;
  value_type *vertex_queue;
  size_type i_queue;
  source_location *local_170;
  size_t iteration;
  size_type i_seed;
  unsigned_long *color;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_138 [8];
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  vertex_queues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined **local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  unsigned_long *local_98;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_color_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *seeds_local;
  Adjacency_Subgraph *graph_local;
  
  local_20 = vertex_color;
  vertex_color_local = seeds;
  seeds_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)graph;
  bVar3 = Adjacency_Subgraph::empty(graph);
  if (bVar3) {
    poVar17 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001c1338;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar17 = std::operator<<(poVar17,(string *)&local_40);
    poVar17 = std::operator<<(poVar17,"Graph is empty.");
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(vertex_color_local);
  if (bVar3) {
    poVar17 = std::operator<<((ostream *)&std::cerr,"\n");
    local_80 = &PTR_s__workspace_llm4binary_github_lic_001c1350;
    console_format_abi_cxx11_(&local_78,(Disa *)0x0,(Log_Level)&local_80,in_RCX);
    poVar17 = std::operator<<(poVar17,(string *)&local_78);
    poVar17 = std::operator<<(poVar17,"There are no seeds to begin expansion.");
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    exit(1);
  }
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vertex_color_local);
  local_98 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(vertex_color_local);
  local_88 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (local_90,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_98);
  puVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_88);
  psVar16 = (source_location *)*puVar4;
  psVar5 = (source_location *)Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)seeds_local);
  pvVar2 = local_20;
  if (psVar5 <= psVar16) {
    poVar17 = std::operator<<((ostream *)&std::cerr,"\n");
    local_c0 = &PTR_s__workspace_llm4binary_github_lic_001c1368;
    console_format_abi_cxx11_(&local_b8,(Disa *)0x0,(Log_Level)&local_c0,psVar5);
    poVar17 = std::operator<<(poVar17,(string *)&local_b8);
    sVar6 = Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)seeds_local);
    std::__cxx11::to_string
              ((string *)
               &vertex_queues.
                super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar6);
    std::operator+(&local_100,"A seed index is not in graph range [0, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vertex_queues.
                    super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_e0,&local_100,").");
    poVar17 = std::operator<<(poVar17,(string *)&local_e0);
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string
              ((string *)
               &vertex_queues.
                super__Vector_base<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_b8);
    exit(1);
  }
  sVar6 = Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)seeds_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar2,sVar6);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(vertex_color_local);
  std::
  allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::allocator((allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)((long)&__range2 + 7));
  std::
  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vector((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            *)local_138,sVar7,
           (allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)((long)&__range2 + 7));
  std::
  allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~allocator((allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)((long)&__range2 + 7));
  pvVar2 = local_20;
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_20);
  color = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar2);
  while (bVar3 = __gnu_cxx::
                 operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&color), ((bVar3 ^ 0xffU) & 1) != 0) {
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    uVar15 = std::numeric_limits<unsigned_long>::max();
    *puVar8 = uVar15;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  for (iteration = 0;
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(vertex_color_local),
      iteration < sVar7; iteration = iteration + 1) {
    this = std::
           vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::operator[]((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)local_138,iteration);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (vertex_color_local,iteration);
    std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
              (this,pvVar9);
    pvVar2 = local_20;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (vertex_color_local,iteration);
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,*pvVar9)
    ;
    *pvVar10 = iteration;
  }
  local_170 = (source_location *)0x0;
  do {
    iVar11 = std::
             vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::begin((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)local_138);
    iVar12 = std::
             vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::end((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)local_138);
    bVar3 = std::
            any_of<__gnu_cxx::__normal_iterator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>>>>,Disa::level_expansion<Disa::Adjacency_Subgraph>(Disa::Adjacency_Subgraph_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(auto:1_const&)_1_>
                      (iVar11._M_current,iVar12._M_current);
    if (!bVar3) {
      std::
      vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~vector((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)local_138);
      return;
    }
    for (vertex_queue = (value_type *)0x0;
        pvVar13 = (value_type *)
                  std::
                  vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::size((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)local_138), vertex_queue < pvVar13;
        vertex_queue = (value_type *)
                       ((long)&(vertex_queue->c).
                               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Deque_impl_data._M_map + 1)) {
      if (((ulong)local_170 & 1) == 0) {
        local_368 = std::
                    vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)local_138,(size_type)vertex_queue);
      }
      else {
        sVar7 = std::
                vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::size((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)local_138);
        local_368 = std::
                    vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((vector<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)local_138,(sVar7 - (long)vertex_queue) - 1);
      }
      new_queue.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_368;
      std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
                ((queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
                 &front);
      while (bVar3 = std::
                     queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ::empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)new_queue.c.
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Deque_impl_data._M_finish._M_node),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar14 = std::
                  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)new_queue.c.
                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node);
        __range5 = (span<const_unsigned_long,_18446744073709551615UL> *)*pvVar14;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                  ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)new_queue.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node);
        sVar18 = Adjacency_Subgraph::operator[]
                           ((Adjacency_Subgraph *)seeds_local,(size_t *)&__range5);
        __begin0._M_current = sVar18._M_ptr;
        __end0 = std::span<const_unsigned_long,_18446744073709551615UL>::begin
                           ((span<const_unsigned_long,_18446744073709551615UL> *)&__begin0);
        vertex = (unsigned_long *)
                 std::span<const_unsigned_long,_18446744073709551615UL>::end
                           ((span<const_unsigned_long,_18446744073709551615UL> *)&__begin0);
        while (bVar3 = __gnu_cxx::
                       operator==<const_unsigned_long_*,_std::span<const_unsigned_long,_18446744073709551615UL>_>
                                 (&__end0,(__normal_iterator<const_unsigned_long_*,_std::span<const_unsigned_long,_18446744073709551615UL>_>
                                           *)&vertex), ((bVar3 ^ 0xffU) & 1) != 0) {
          local_220 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::span<const_unsigned_long,_18446744073709551615UL>_>
                      ::operator*(&__end0);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (local_20,*local_220);
          vVar1 = *pvVar10;
          uVar15 = std::numeric_limits<unsigned_long>::max();
          if (vVar1 == uVar15) {
            std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&front,local_220);
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (local_20,(size_type)__range5);
            vVar1 = *pvVar10;
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (local_20,*local_220);
            *pvVar10 = vVar1;
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::span<const_unsigned_long,_18446744073709551615UL>_>
          ::operator++(&__end0);
        }
      }
      std::swap<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>
                ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&front,(queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)new_queue.c.
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                            .super__Deque_impl_data._M_finish._M_node);
      std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
                ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&front);
    }
    psVar16 = (source_location *)((long)&local_170->_M_impl + 1);
    psVar5 = (source_location *)Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)seeds_local);
    bVar3 = local_170 < psVar5;
    local_170 = psVar16;
  } while (bVar3);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\n");
  local_248 = &PTR_s__workspace_llm4binary_github_lic_001c1380;
  console_format_abi_cxx11_(&local_240,(Disa *)0x0,(Log_Level)&local_248,psVar5);
  poVar17 = std::operator<<(poVar17,(string *)&local_240);
  std::__cxx11::to_string(&local_2a8,(unsigned_long)psVar16);
  std::operator+(&local_288,"Number of iterations have exceeded, ",&local_2a8);
  std::operator+(&local_268,&local_288,". Is the graph disjoint?");
  poVar17 = std::operator<<(poVar17,(string *)&local_268);
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_240);
  exit(1);
}

Assistant:

void level_expansion(const _graph& graph, const std::vector<std::size_t>& seeds,
                     std::vector<std::size_t>& vertex_color) {
  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(!seeds.empty(), "There are no seeds to begin expansion.");
  ASSERT_DEBUG(*std::max_element(seeds.begin(), seeds.end()) < graph.size_vertex(),
               "A seed index is not in graph range [0, " + std::to_string(graph.size_vertex()) + ").");

  // Setup memory, and seed the queues and colors.
  vertex_color.resize(graph.size_vertex());
  std::vector<std::queue<std::size_t>> vertex_queues(seeds.size());
  FOR_EACH_REF(color, vertex_color) color = std::numeric_limits<std::size_t>::max();
  FOR(i_seed, seeds.size()) {
    vertex_queues[i_seed].push({seeds[i_seed]});
    vertex_color[seeds[i_seed]] = i_seed;
  }

  // Color vertices.
  std::size_t iteration = 0;
  while(std::any_of(vertex_queues.begin(), vertex_queues.end(), [](const auto& queue) { return !queue.empty(); })) {
    FOR(i_queue, vertex_queues.size()) {
      // ensures we do a forward's and backwards sweep to try and keep expansion 'unbiased'.
      auto& vertex_queue =
      iteration % 2 == 0 ? vertex_queues[i_queue] : vertex_queues[vertex_queues.size() - i_queue - 1];

      // Perform a level expansion for this color.
      std::queue<std::size_t> new_queue;
      while(!vertex_queue.empty()) {
        const std::size_t front = vertex_queue.front();
        vertex_queue.pop();
        FOR_EACH(vertex, graph[front]) {
          if(vertex_color[vertex] == std::numeric_limits<std::size_t>::max()) {
            new_queue.push(vertex);
            vertex_color[vertex] = vertex_color[front];
          }
        }
      }
      std::swap(new_queue, vertex_queue);
    }
    ASSERT(iteration++ < graph.size_vertex(),
           "Number of iterations have exceeded, " + std::to_string(iteration) + ". Is the graph disjoint?");
  }
}